

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O0

void __thiscall ObjTable<Test>::forEach(ObjTable<Test> *this,function<void_(int,_const_Test_&)> *fn)

{
  bool bVar1;
  int __args;
  reference __args_1;
  reference __in;
  type *i_00;
  type *__args_1_00;
  type *item_1;
  type *id;
  _Self local_58;
  iterator __end0_1;
  iterator __begin0_1;
  map<unsigned_long,_Test,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Test>_>_>
  *__range2_1;
  Test *item;
  iterator __end0;
  iterator __begin0;
  ObjTable<Test> *__range2;
  int i;
  function<void_(int,_const_Test_&)> *fn_local;
  ObjTable<Test> *this_local;
  
  __range2._4_4_ = 0;
  __end0 = std::vector<Test,_std::allocator<Test>_>::begin
                     (&this->super_vector<Test,_std::allocator<Test>_>);
  item = (Test *)std::vector<Test,_std::allocator<Test>_>::end
                           (&this->super_vector<Test,_std::allocator<Test>_>);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<Test_*,_std::vector<Test,_std::allocator<Test>_>_>
                                *)&item);
    if (!bVar1) break;
    __args_1 = __gnu_cxx::__normal_iterator<Test_*,_std::vector<Test,_std::allocator<Test>_>_>::
               operator*(&__end0);
    std::function<void_(int,_const_Test_&)>::operator()(fn,__range2._4_4_,__args_1);
    __gnu_cxx::__normal_iterator<Test_*,_std::vector<Test,_std::allocator<Test>_>_>::operator++
              (&__end0);
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  __end0_1 = std::
             map<unsigned_long,_Test,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Test>_>_>
             ::begin(&this->sparse_elements);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_Test,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Test>_>_>
       ::end(&this->sparse_elements);
  while( true ) {
    bVar1 = std::operator!=(&__end0_1,&local_58);
    if (!bVar1) break;
    __in = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Test>_>::operator*(&__end0_1);
    i_00 = std::get<0ul,unsigned_long_const,Test>(__in);
    __args_1_00 = std::get<1ul,unsigned_long_const,Test>(__in);
    __args = QIntC::to_int<unsigned_long>(i_00);
    std::function<void_(int,_const_Test_&)>::operator()(fn,__args,__args_1_00);
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Test>_>::operator++(&__end0_1);
  }
  return;
}

Assistant:

inline void
    forEach(std::function<void(int, const T&)> fn)
    {
        int i = 0;
        for (auto const& item: *this) {
            fn(i++, item);
        }
        for (auto const& [id, item]: sparse_elements) {
            fn(QIntC::to_int(id), item);
        }
    }